

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_hash.c
# Opt level: O0

uint qc_hashbin(void *key,uint uLength,uint bucket_count)

{
  int iVar1;
  int local_30;
  uint local_2c;
  uint j;
  uint i;
  uint ret;
  uint hash_value;
  uchar *psz;
  uint bucket_count_local;
  uint uLength_local;
  void *key_local;
  
  i = 0;
  local_30 = 0;
  j = 0;
  _ret = (byte *)key;
  for (local_2c = 0; local_2c < uLength; local_2c = local_2c + 1) {
    if (local_30 == 5) {
      local_30 = 0;
      j = i + j;
      i = 0;
    }
    iVar1 = tolower((uint)*_ret);
    i = iVar1 + i * 9;
    _ret = _ret + 1;
    local_30 = local_30 + 1;
  }
  return (i + j) % bucket_count;
}

Assistant:

unsigned int qc_hashbin(void *key, unsigned int uLength, unsigned int bucket_count)
{
    unsigned char *psz;
    unsigned int hash_value;
    unsigned int ret;
    unsigned int i;
    unsigned int j;

    psz = (unsigned char *)key;
    hash_value = 0;

    j = 0;
    ret = 0;
    i = 0;
    while(i < uLength)
    {
	    if(j == 5)
	    {
		    j = 0;
		    ret += hash_value;
		    hash_value = 0;
	    }
	    hash_value += hash_value << 3;
	    hash_value += (unsigned int)tolower( *psz );
	    psz++;
	    j++;
	    i++;
    }

    ret += hash_value;

    return ret % bucket_count;
}